

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O1

grid_iterator<long> *
idx2::Begin<long>(grid_iterator<long> *__return_storage_ptr__,grid *Grid,volume *Vol)

{
  u64 uVar1;
  int iVar2;
  uint uVar3;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar4;
  
  __return_storage_ptr__->Ptr = (long *)0x0;
  uVar1 = Grid->Strd;
  uVar3 = (uint)((long)(uVar1 << 0x2b) >> 0x2b);
  (__return_storage_ptr__->S).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)
       ((long)(uVar1 << 0x16) >> 0xb & 0xffffffff00000000U | (ulong)uVar3);
  iVar2 = (int)((long)(uVar1 * 2) >> 0x2b);
  (__return_storage_ptr__->S).field_0.field_0.Z = iVar2;
  uVar1 = (Grid->super_extent).Dims;
  aVar4.field_0.Y =
       (int)((long)(uVar1 << 0x16) >> 0x2b) * (__return_storage_ptr__->S).field_0.field_0.Y;
  aVar4.field_0.X = (((int)uVar1 << 0xb) >> 0xb) * uVar3;
  (__return_storage_ptr__->D).field_0.field_3.XY.field_0 = aVar4;
  (__return_storage_ptr__->D).field_0.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b) * iVar2;
  (__return_storage_ptr__->P).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  (__return_storage_ptr__->P).field_0.field_0.Z = 0;
  uVar1 = Vol->Dims;
  uVar3 = (uint)((long)(uVar1 << 0x2b) >> 0x2b);
  (__return_storage_ptr__->N).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)
       ((long)(uVar1 << 0x16) >> 0xb & 0xffffffff00000000U | (ulong)uVar3);
  (__return_storage_ptr__->N).field_0.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b);
  uVar1 = (Grid->super_extent).From;
  __return_storage_ptr__->Ptr =
       (long *)((Vol->Buffer).Data +
               ((long)(uVar1 << 0x2b) >> 0x28) +
               ((long)(uVar1 << 0x16) >> 0x2b) * (long)(int)uVar3 * 8 +
               (long)(__return_storage_ptr__->N).field_0.field_0.Y * ((long)(uVar1 * 2) >> 0x2b) *
               (long)(int)uVar3 * 8);
  return __return_storage_ptr__;
}

Assistant:

grid_iterator<t>
Begin(const grid& Grid, const volume& Vol)
{
  grid_iterator<t> Iter;
  Iter.S = Strd(Grid);
  Iter.D = Dims(Grid) * Iter.S;
  Iter.P = v3i(0);
  Iter.N = Dims(Vol);
  Iter.Ptr = (t*)const_cast<byte*>(Vol.Buffer.Data) + Row(Iter.N, From(Grid));
  return Iter;
}